

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GetPresenceIndex
          (MessageGenerator *this,FieldDescriptor *descriptor)

{
  bool bVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar2;
  size_type sVar3;
  const_reference ppFVar4;
  LogMessage *this_00;
  FieldDescriptor *in_RSI;
  MessageGenerator *in_RDI;
  FieldDescriptor *field;
  int i;
  int index;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  LogMessage *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  FieldDescriptor *in_stack_ffffffffffffffb8;
  int local_20;
  int local_1c;
  
  bVar1 = IsNullable(in_stack_ffffffffffffffb8);
  if (!bVar1) {
    Descriptor::file(in_RDI->descriptor_);
    bVar1 = IsProto2((FileDescriptor *)0x52e4fb);
    if (bVar1) {
      local_1c = 0;
      local_20 = 0;
      while( true ) {
        pvVar2 = fields_by_number(in_RDI);
        sVar3 = std::
                vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ::size(pvVar2);
        if (sVar3 <= (ulong)(long)local_20) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)&stack0xffffffffffffffa0,
                     (LogLevel)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                     (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
          internal::LogMessage::operator<<
                    (in_stack_ffffffffffffff60,
                     (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          FieldDescriptor::name_abi_cxx11_(in_RSI);
          this_00 = internal::LogMessage::operator<<
                              (in_stack_ffffffffffffff60,
                               (string *)
                               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          internal::LogFinisher::operator=
                    ((LogFinisher *)this_00,
                     (LogMessage *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
          internal::LogMessage::~LogMessage((LogMessage *)0x52e656);
          return -1;
        }
        pvVar2 = fields_by_number(in_RDI);
        ppFVar4 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[](pvVar2,(long)local_20);
        if (*ppFVar4 == in_RSI) break;
        bVar1 = IsNullable(in_stack_ffffffffffffffb8);
        if (!bVar1) {
          local_1c = local_1c + 1;
        }
        local_20 = local_20 + 1;
      }
      return local_1c;
    }
  }
  return -1;
}

Assistant:

int MessageGenerator::GetPresenceIndex(const FieldDescriptor* descriptor) {
  if (IsNullable(descriptor) || !IsProto2(descriptor_->file())) {
    return -1;
  }

  int index = 0;
  for (int i = 0; i < fields_by_number().size(); i++) {
    const FieldDescriptor* field = fields_by_number()[i];
    if (field == descriptor) {
      return index;
    }
    if (!IsNullable(field)) {
      index++;
    }
  }
  GOOGLE_LOG(DFATAL)<< "Could not find presence index for field " << descriptor->name();
  return -1;
}